

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void __thiscall CVmBigNumCache::release_all(CVmBigNumCache *this)

{
  CVmBigNumCacheReg *pCVar1;
  size_t i;
  
  for (i = 0; i < this->max_regs_; i = i + 1) {
    pCVar1 = this->reg_;
    pCVar1[i & 0xffffffff].nxt_ = this->free_reg_;
    this->free_reg_ = pCVar1 + (i & 0xffffffff);
  }
  return;
}

Assistant:

void CVmBigNumCache::release_all()
{
    size_t i;

    /* mark each of our registers as not in use */
    for (i = 0 ; i < max_regs_ ; ++i)
        release_reg(i);
}